

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_ChaseSight(void)

{
  pointer *ppRVar1;
  vector<AI::Task,_std::allocator<AI::Task>_> *this;
  iterator __position;
  pointer pTVar2;
  _Manager_type p_Var3;
  Task *in_RDI;
  Task move;
  Task stop;
  Task bark;
  string local_aa8;
  SatisfiablePredicateParams local_a88;
  value_type local_a80;
  Task local_708;
  undefined1 local_390 [888];
  
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"chaseSight","");
  Task::Task(in_RDI,&local_aa8,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  in_RDI->identifier = ChaseSight;
  local_390._0_5_ = 0x100000003;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)local_390);
  local_390._0_4_ = Alertness;
  local_390[4] = true;
  local_390._5_3_ = 0;
  local_390._8_4_ = 60.0;
  __position._M_current =
       (in_RDI->preconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RDI->preconditions).requiredValues.
      super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::
    _M_realloc_insert<AI::RequiredValue>
              (&(in_RDI->preconditions).requiredValues,__position,(RequiredValue *)local_390);
  }
  else {
    (__position._M_current)->value = 60.0;
    (__position._M_current)->id = Alertness;
    (__position._M_current)->op = GreaterThan;
    ppRVar1 = &(in_RDI->preconditions).requiredValues.
               super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  create_Bark((Task *)local_390,RegainedSightOfPlayer);
  create_MoveToPlayer();
  p_Var3 = local_a80.loop.super__Function_base._M_manager;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_a80.loop.super__Function_base._M_functor._M_unused._0_8_;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a80.loop.super__Function_base._M_functor._8_8_;
  local_a80.loop.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a80.loop.super__Function_base._M_functor._8_8_ = 0;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a80.loop.super__Function_base._M_manager;
  local_a80.loop.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:273:15)>
       ::_M_manager;
  local_708.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a80.loop._M_invoker;
  local_a80.loop._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:273:15)>
       ::_M_invoke;
  if ((pointer)p_Var3 != (pointer)0x0) {
    (*p_Var3)(&local_708,&local_708,3);
  }
  p_Var3 = local_a80.finally.super__Function_base._M_manager;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_a80.finally.super__Function_base._M_functor._M_unused._0_8_;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_a80.finally.super__Function_base._M_functor._8_8_;
  local_a80.finally.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a80.finally.super__Function_base._M_functor._8_8_ = 0;
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a80.finally.super__Function_base._M_manager;
  local_a80.finally.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:286:18)>
       ::_M_manager;
  local_708.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a80.finally._M_invoker;
  local_a80.finally._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:286:18)>
       ::_M_invoke;
  if ((pointer)p_Var3 != (pointer)0x0) {
    (*p_Var3)(&local_708,&local_708,3);
  }
  Task::Task(&local_708);
  std::__cxx11::string::_M_replace
            ((ulong)&local_708.debugName,0,(char *)local_708.debugName._M_string_length,0x131425);
  local_708.action = StopMoving;
  this = &in_RDI->subtasks;
  pTVar2 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar2) {
    pTVar2[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,(value_type *)local_390);
  pTVar2 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar2;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_a80);
  pTVar2 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar2;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_708);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  local_a88.identifier = NearPlayer;
  local_a88.index = -1;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->postconditions).satisfiedPredicates,&local_a88);
  Task::~Task(&local_708);
  Task::~Task(&local_a80);
  Task::~Task((Task *)local_390);
  return in_RDI;
}

Assistant:

Task create_ChaseSight()
	{
		Task chaseSight {"chaseSight", TaskType::Compound};
		chaseSight.identifier = TaskIdentifier::ChaseSight;
		chaseSight.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		chaseSight.preconditions.requiredValues.push_back(
			{WorldStateIdentifier::Alertness, ConditionOp::GreaterThan, 60.f});

		auto bark = create_Bark(Bark::RegainedSightOfPlayer);
		auto move = create_MoveToPlayer();

		move.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		move.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};

		Task stop;
		stop.debugName = "stop";
		stop.action = Action::StopMoving;

		chaseSight.addSubtask(bark);
		chaseSight.addSubtask(move);
		chaseSight.addSubtask(stop);

		chaseSight.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return chaseSight;
	}